

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O2

ModulusPoly * __thiscall
ZXing::Pdf417::ModulusPoly::multiply
          (ModulusPoly *__return_storage_ptr__,ModulusPoly *this,int scalar)

{
  int iVar1;
  size_t i;
  size_type sVar2;
  size_type __n;
  vector<int,_std::allocator<int>_> product;
  allocator_type local_41;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  if (scalar != 1) {
    if (scalar != 0) {
      __n = (long)(this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_40,__n,&local_41);
      for (sVar2 = 0; __n != sVar2; sVar2 = sVar2 + 1) {
        iVar1 = ModulusGF::multiply(this->_field,
                                    (this->_coefficients).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[sVar2],scalar);
        local_40._M_impl.super__Vector_impl_data._M_start[sVar2] = iVar1;
      }
      ModulusPoly(__return_storage_ptr__,this->_field,(vector<int,_std::allocator<int>_> *)&local_40
                 );
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
      return __return_storage_ptr__;
    }
    this = &this->_field->_zero;
  }
  ModulusPoly(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

ModulusPoly
ModulusPoly::multiply(int scalar) const
{
	if (scalar == 0) {
		return _field->zero();
	}
	if (scalar == 1) {
		return *this;
	}
	size_t size = _coefficients.size();
	std::vector<int> product(size);
	for (size_t i = 0; i < size; i++) {
		product[i] = _field->multiply(_coefficients[i], scalar);
	}
	return ModulusPoly(*_field, product);
}